

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

void slang::ast::Lookup::unqualifiedImpl
               (Scope *scope,string_view name,LookupLocation location,
               optional<slang::SourceRange> sourceRange,bitmask<slang::ast::LookupFlags> flags,
               SymbolIndex outOfBlockIndex,LookupResult *result,Scope *originalScope,
               SyntaxNode *originalSyntax)

{
  char *pcVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  SymbolKind SVar4;
  long lVar5;
  int *piVar6;
  SourceManager *this;
  WildcardImportData *pWVar7;
  pointer ppWVar8;
  WildcardImportSymbol *this_00;
  group_type_pointer pgVar9;
  value_type_pointer ppVar10;
  ClassType *this_01;
  Scope *scope_00;
  uint uVar11;
  undefined1 auVar12 [16];
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  optional<slang::SourceRange> sourceRange_03;
  string_view lookupName;
  string_view arg;
  string_view name_00;
  string_view arg_00;
  size_type sVar16;
  bool bVar17;
  bool bVar18;
  optional<bool> oVar19;
  uint uVar20;
  uint uVar21;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_02;
  uint64_t uVar22;
  DeclaredType *pDVar23;
  PackageSymbol *this_03;
  pointer pIVar24;
  Symbol *pSVar25;
  Diagnostic *pDVar26;
  Type *pTVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  string_view *sv;
  SymbolIndex SVar31;
  SourceLocation SVar32;
  long lVar33;
  SourceLocation SVar34;
  SourceLocation SVar35;
  ulong uVar36;
  ulong uVar37;
  SubroutineSymbol *sub;
  SymbolIndex outOfBlockIndex_00;
  value_type_pointer __y;
  Import *pair;
  basic_string_view<char,_std::char_traits<char>_> *__y_00;
  pointer ppWVar38;
  size_t __n;
  char cVar39;
  char cVar43;
  char cVar44;
  byte bVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  byte bVar47;
  undefined1 auVar46 [16];
  pair<const_slang::ast::ClassType_*,_bool> pVar48;
  LookupLocation location_00;
  Symbol *imported;
  string_view name_local;
  SmallVector<Import,_4UL> imports;
  anon_class_32_4_2e62d3a1 reportRecursiveError;
  locator local_e0;
  SmallSet<const_slang::ast::Symbol_*,_2UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
  importDedup;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  uVar21 = location.index;
  reportRecursiveError.sourceRange = &sourceRange;
  reportRecursiveError.result = result;
  reportRecursiveError.scope = scope;
  reportRecursiveError.name = &name_local;
  this_02 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
            Scope::getNameMap(scope);
  uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     (this_02,&name_local);
  SVar32 = (SourceLocation)(uVar22 >> ((byte)*this_02 & 0x3f));
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar22 & 0xff];
  SVar35 = (SourceLocation)0x0;
  uVar28 = 0;
LAB_002ac9d6:
  lVar33 = *(long *)(this_02 + 0x10);
  pcVar1 = (char *)(lVar33 + (long)SVar32 * 0x10);
  bVar45 = pcVar1[0xf];
  cVar39 = (char)uVar3;
  auVar40[0] = -(*pcVar1 == cVar39);
  cVar43 = (char)((uint)uVar3 >> 8);
  auVar40[1] = -(pcVar1[1] == cVar43);
  cVar44 = (char)((uint)uVar3 >> 0x10);
  auVar40[2] = -(pcVar1[2] == cVar44);
  bVar47 = (byte)((uint)uVar3 >> 0x18);
  auVar40[3] = -(pcVar1[3] == bVar47);
  auVar40[4] = -(pcVar1[4] == cVar39);
  auVar40[5] = -(pcVar1[5] == cVar43);
  auVar40[6] = -(pcVar1[6] == cVar44);
  auVar40[7] = -(pcVar1[7] == bVar47);
  auVar40[8] = -(pcVar1[8] == cVar39);
  auVar40[9] = -(pcVar1[9] == cVar43);
  auVar40[10] = -(pcVar1[10] == cVar44);
  auVar40[0xb] = -(pcVar1[0xb] == bVar47);
  auVar40[0xc] = -(pcVar1[0xc] == cVar39);
  auVar40[0xd] = -(pcVar1[0xd] == cVar43);
  auVar40[0xe] = -(pcVar1[0xe] == cVar44);
  auVar40[0xf] = -(bVar45 == bVar47);
  uVar20 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
  if (uVar20 != 0) {
    lVar5 = *(long *)(this_02 + 0x18);
LAB_002aca37:
    uVar11 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    __y_00 = (basic_string_view<char,_std::char_traits<char>_> *)
             ((ulong)uVar11 * 0x18 + lVar5 + (long)SVar32 * 0x168);
    SVar34 = (SourceLocation)&name_local;
    bVar17 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                       ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)this_02,
                        (basic_string_view<char,_std::char_traits<char>_> *)SVar34,__y_00);
    if (!bVar17) goto code_r0x002aca5b;
    SVar35 = (SourceLocation)__y_00[1]._M_len;
    iVar30 = *(int *)SVar35;
    if (*(uint *)((long)SVar35 + 0x30) < uVar21) {
      bVar17 = true;
      if ((originalSyntax != (SyntaxNode *)0x0) && (iVar30 == 5)) {
        piVar6 = *(int **)((long)SVar35 + 0x40);
        bVar17 = true;
        if (*piVar6 != 0xb) goto LAB_002accab;
        SVar32 = *(SourceLocation *)(*(long *)(*(long *)(*(long *)(piVar6 + 8) + 8) + 0x20) + 8);
        if (*(int *)SVar32 == 0x16) {
          pVar48 = getContainingClass(scope);
          if (pVar48.first == (ClassType *)0x0) goto LAB_002acbaa;
          bVar18 = Type::isDerivedFrom(&(pVar48.first)->super_Type,(Type *)SVar32);
          SVar34 = SVar32;
        }
        else {
LAB_002acbaa:
          bVar18 = false;
        }
        this = scope->compilation->sourceManager;
        if (this != (SourceManager *)0x0 && bVar18 == false) {
          imports.super_SmallVectorBase<Import>._0_16_ =
               slang::syntax::SyntaxNode::getFirstToken(originalSyntax);
          SVar32 = parsing::Token::location((Token *)&imports);
          SVar34 = *(SourceLocation *)(piVar6 + 6);
          oVar19 = SourceManager::isBeforeInCompilationUnit(this,SVar34,SVar32);
          if (((ushort)oVar19.super__Optional_base<bool,_true,_true>._M_payload.
                       super__Optional_payload_base<bool> & 1) == 0 &&
              ((ushort)oVar19.super__Optional_base<bool,_true,_true>._M_payload.
                       super__Optional_payload_base<bool> >> 8 & 1) != 0) goto LAB_002acc9e;
        }
        goto LAB_002accab;
      }
      goto LAB_002accaf;
    }
    bVar17 = true;
    if (iVar30 - 0x4fU < 2) goto LAB_002accab;
    if ((iVar30 == 0xb) || (iVar30 == 0x4a)) {
LAB_002acb9d:
      flags.m_bits = flags.m_bits & 0x7ffd;
LAB_002acc9e:
      SVar32 = SVar34;
      if ((flags.m_bits & 2) == 0) goto LAB_002acdc5;
      bVar17 = false;
    }
    else {
      if (iVar30 == 0x23) {
        lVar33 = 0x90;
      }
      else {
        if (iVar30 == 0x27) goto LAB_002acb9d;
        if (iVar30 == 0x40) {
          if ((*(byte *)((long)SVar35 + 0xb7) & 0x40) != 0) goto LAB_002acdb3;
          pTVar27 = DeclaredType::getType((DeclaredType *)((long)SVar35 + 0x78));
          bVar18 = Type::isVoid(pTVar27);
          if (!bVar18) {
            bVar45 = *(byte *)((long)SVar35 + 0xc5);
joined_r0x002acc39:
            if ((bVar45 & 2) == 0) goto LAB_002acc9e;
          }
          goto LAB_002accab;
        }
        if (iVar30 == 0x43) {
          lVar33 = 0x2d0;
          goto LAB_002acc87;
        }
        if (iVar30 == 0x44) {
          if ((*(byte *)((long)SVar35 + 0xb7) & 0x40) == 0) {
            pTVar27 = DeclaredType::getType((DeclaredType *)((long)SVar35 + 0x78));
            bVar18 = Type::isVoid(pTVar27);
            if (!bVar18) {
              bVar45 = *(byte *)((long)SVar35 + 0xc1);
              goto joined_r0x002acc39;
            }
            goto LAB_002accab;
          }
          goto LAB_002acdb3;
        }
        if (iVar30 != 0x16) goto LAB_002acc9e;
        lVar33 = 0xa8;
      }
LAB_002acc87:
      if ((*(long *)((long)SVar35 + lVar33) == 0) ||
         (uVar20 = *(uint *)(*(long *)((long)SVar35 + lVar33) + 0x30),
         (result->flags).m_bits = (result->flags).m_bits | 0x10, uVar21 <= uVar20))
      goto LAB_002acc9e;
    }
LAB_002accab:
    iVar30 = *(int *)SVar35;
LAB_002accaf:
    if (iVar30 == 5) {
      do {
        SVar35 = *(SourceLocation *)((long)SVar35 + 0x40);
        iVar30 = *(int *)SVar35;
      } while (iVar30 == 5);
      if (((**(int **)(*(long *)((long)SVar35 + 0x20) + 8) == 0x62) &&
          (bVar18 = anon_unknown_39::isInProgram(originalScope->thisSym), !bVar18)) &&
         (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged == true)) {
        sourceRange_00.endLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
        sourceRange_00.startLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
        pDVar26 = LookupResult::addDiag(result,scope,(DiagCode)0xf000a,sourceRange_00);
        SVar34 = (SourceLocation)0x50001;
        Diagnostic::addNote(pDVar26,(DiagCode)0x50001,*(SourceLocation *)((long)SVar35 + 0x18));
        iVar30 = *(int *)SVar35;
      }
    }
    if (iVar30 == 0x25) {
LAB_002acd59:
      SVar32 = (SourceLocation)result->found;
LAB_002acd79:
      if (SVar32 == (SourceLocation)0x0) {
        return;
      }
    }
    else {
      if (iVar30 == 0x2e) {
        SVar32 = *(SourceLocation *)((long)SVar35 + 0x40);
        result->found = (Symbol *)SVar32;
        goto LAB_002acd79;
      }
      if (iVar30 == 0x44) {
        SVar32 = (SourceLocation)
                 MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)SVar35);
        result->found = (Symbol *)SVar32;
        goto LAB_002acd79;
      }
      if (iVar30 == 0x33) {
        pSVar25 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)SVar35);
        result->found = pSVar25;
        (result->flags).m_bits = (result->flags).m_bits | 1;
        SVar34 = SVar35;
        Compilation::noteReference(scope->compilation,(Symbol *)SVar35,false);
        goto LAB_002acd59;
      }
      result->found = (Symbol *)SVar35;
      SVar32 = SVar35;
    }
    pDVar23 = Symbol::getDeclaredType((Symbol *)SVar32);
    if (pDVar23 == (DeclaredType *)0x0) {
      return;
    }
    if ((pDVar23->field_0x3f & 0x40) == 0) {
      return;
    }
    if (!bVar17) {
      LookupResult::clear(result);
      SVar32 = SVar34;
      goto LAB_002acdc5;
    }
    SVar35 = (SourceLocation)result->found;
LAB_002acdb3:
    unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()(&reportRecursiveError,(Symbol *)SVar35);
    return;
  }
  goto LAB_002aca90;
code_r0x002aca5b:
  uVar20 = uVar20 - 1 & uVar20;
  if (uVar20 == 0) goto code_r0x002aca69;
  goto LAB_002aca37;
code_r0x002aca69:
  bVar45 = *(byte *)(lVar33 + (long)SVar32 * 0x10 + 0xf);
LAB_002aca90:
  if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
         is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bVar45) == 0)
  goto LAB_002acdc5;
  lVar33 = (long)SVar32 + uVar28;
  uVar28 = uVar28 + 1;
  SVar32 = (SourceLocation)(lVar33 + 1U & *(ulong *)(this_02 + 8));
  if (*(ulong *)(this_02 + 8) < uVar28) goto LAB_002acdc5;
  goto LAB_002ac9d6;
LAB_002acdc5:
  pWVar7 = scope->importData;
  if (pWVar7 == (WildcardImportData *)0x0) {
LAB_002ad4bc:
    this_01 = (ClassType *)scope->thisSym;
    scope_00 = (this_01->super_Type).super_Symbol.parentScope;
    if (scope_00 != (Scope *)0x0) {
      SVar31 = (this_01->super_Type).super_Symbol.indexInScope + 1;
      SVar4 = (this_01->super_Type).super_Symbol.kind;
      if (SVar4 == ConstraintBlock) {
        outOfBlockIndex_00._0_1_ = this_01->isAbstract;
        outOfBlockIndex_00._1_1_ = this_01->isInterface;
        outOfBlockIndex_00._2_1_ = this_01->isFinal;
        outOfBlockIndex_00._3_1_ = this_01->isUninstantiated;
      }
      else if (SVar4 == Subroutine) {
        outOfBlockIndex_00 = (SymbolIndex)(this_01->declaredIfaces)._M_extent._M_extent_value;
      }
      else {
        if (outOfBlockIndex != 0) {
          SVar31 = outOfBlockIndex;
        }
        outOfBlockIndex_00 = 0;
        if (((SVar4 == ClassType) &&
            (pTVar27 = ClassType::getBaseClass(this_01), pTVar27 != (Type *)0x0)) &&
           (bVar17 = Type::isError(pTVar27), bVar17)) {
          (result->flags).m_bits = (result->flags).m_bits | 4;
        }
      }
      if (((flags.m_bits >> 0xe & 1) == 0) || (scope_00->thisSym->kind != CompilationUnit)) {
        name_00._M_str = name_local._M_str;
        name_00._M_len = name_local._M_len;
        sourceRange_03.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._17_7_ =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._17_7_;
        sourceRange_03.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_engaged;
        sourceRange_03.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
        sourceRange_03.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
        location_00.index = SVar31;
        location_00.scope = (Scope *)&sourceRange;
        location_00._12_4_ = 0;
        unqualifiedImpl(scope_00,name_00,location_00,sourceRange_03,flags,outOfBlockIndex_00,result,
                        originalScope,originalSyntax);
      }
    }
    return;
  }
  if ((flags.m_bits & 4) != 0) {
    if (pWVar7->hasForceElaborated == false) {
      pWVar7->hasForceElaborated = true;
      Compilation::forceElaborate(scope->compilation,scope->thisSym);
    }
    uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        &pWVar7->importedSymbols,&name_local);
    uVar29 = uVar22 >> ((byte)(pWVar7->importedSymbols).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar33 = (uVar22 & 0xff) * 4;
    uVar13 = (&UNK_0040c7ac)[lVar33];
    uVar14 = (&UNK_0040c7ad)[lVar33];
    uVar15 = (&UNK_0040c7ae)[lVar33];
    bVar45 = (&UNK_0040c7af)[lVar33];
    uVar28 = 0;
    do {
      pgVar9 = (pWVar7->importedSymbols).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_;
      pgVar2 = pgVar9 + uVar29;
      bVar47 = pgVar2->m[0xf].n;
      auVar41[0] = -(pgVar2->m[0].n == uVar13);
      auVar41[1] = -(pgVar2->m[1].n == uVar14);
      auVar41[2] = -(pgVar2->m[2].n == uVar15);
      auVar41[3] = -(pgVar2->m[3].n == bVar45);
      auVar41[4] = -(pgVar2->m[4].n == uVar13);
      auVar41[5] = -(pgVar2->m[5].n == uVar14);
      auVar41[6] = -(pgVar2->m[6].n == uVar15);
      auVar41[7] = -(pgVar2->m[7].n == bVar45);
      auVar41[8] = -(pgVar2->m[8].n == uVar13);
      auVar41[9] = -(pgVar2->m[9].n == uVar14);
      auVar41[10] = -(pgVar2->m[10].n == uVar15);
      auVar41[0xb] = -(pgVar2->m[0xb].n == bVar45);
      auVar41[0xc] = -(pgVar2->m[0xc].n == uVar13);
      auVar41[0xd] = -(pgVar2->m[0xd].n == uVar14);
      auVar41[0xe] = -(pgVar2->m[0xe].n == uVar15);
      auVar41[0xf] = -(bVar47 == bVar45);
      uVar21 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
      if (uVar21 != 0) {
        ppVar10 = (pWVar7->importedSymbols).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .arrays.elements_;
        do {
          uVar20 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          __y = ppVar10 + uVar29 * 0xf + (ulong)uVar20;
          bVar17 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              &pWVar7->importedSymbols,&name_local,&__y->first);
          if (bVar17) {
            (result->flags).m_bits = (result->flags).m_bits | 1;
            result->found = __y->second;
            return;
          }
          uVar21 = uVar21 - 1 & uVar21;
        } while (uVar21 != 0);
        bVar47 = pgVar9[uVar29].m[0xf].n;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bVar47) == 0) break;
      uVar36 = (pWVar7->importedSymbols).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_size_mask;
      lVar33 = uVar29 + uVar28;
      uVar28 = uVar28 + 1;
      uVar29 = lVar33 + 1U & uVar36;
    } while (uVar28 <= uVar36);
    goto LAB_002ad4bc;
  }
  imports.super_SmallVectorBase<Import>.len = 0;
  imports.super_SmallVectorBase<Import>.data_ =
       (pointer)imports.super_SmallVectorBase<Import>.firstElement;
  imports.super_SmallVectorBase<Import>.cap = 4;
  SmallSet<const_slang::ast::Symbol_*,_2UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
  ::SmallSet(&importDedup);
  ppWVar38 = (pWVar7->wildcardImports).
             super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppWVar8 = (pWVar7->wildcardImports).
            super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  while ((ppWVar38 != ppWVar8 &&
         (this_00 = *ppWVar38, (this_00->super_Symbol).indexInScope + 1 <= uVar21))) {
    this_03 = WildcardImportSymbol::getPackage(this_00);
    if (this_03 == (PackageSymbol *)0x0) {
      (result->flags).m_bits = (result->flags).m_bits | 4;
    }
    else {
      lookupName._M_str = name_local._M_str;
      lookupName._M_len = name_local._M_len;
      imported = PackageSymbol::findForImport(this_03,lookupName);
      SVar32 = (SourceLocation)imported;
      if ((SourceLocation)imported != (SourceLocation)0x0) {
        auVar12._8_8_ = 0;
        auVar12._0_8_ = imported;
        uVar36 = SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar29 = uVar36 >> (importDedup._32_1_ & 0x3f);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar36 & 0xff];
        uVar37 = 0;
        uVar28 = uVar29;
        do {
          pcVar1 = (char *)(importDedup._48_8_ + uVar28 * 0x10);
          cVar39 = (char)uVar3;
          auVar46[0] = -(*pcVar1 == cVar39);
          cVar43 = (char)((uint)uVar3 >> 8);
          auVar46[1] = -(pcVar1[1] == cVar43);
          cVar44 = (char)((uint)uVar3 >> 0x10);
          auVar46[2] = -(pcVar1[2] == cVar44);
          bVar45 = (byte)((uint)uVar3 >> 0x18);
          auVar46[3] = -(pcVar1[3] == bVar45);
          auVar46[4] = -(pcVar1[4] == cVar39);
          auVar46[5] = -(pcVar1[5] == cVar43);
          auVar46[6] = -(pcVar1[6] == cVar44);
          auVar46[7] = -(pcVar1[7] == bVar45);
          auVar46[8] = -(pcVar1[8] == cVar39);
          auVar46[9] = -(pcVar1[9] == cVar43);
          auVar46[10] = -(pcVar1[10] == cVar44);
          auVar46[0xb] = -(pcVar1[0xb] == bVar45);
          auVar46[0xc] = -(pcVar1[0xc] == cVar39);
          auVar46[0xd] = -(pcVar1[0xd] == cVar43);
          auVar46[0xe] = -(pcVar1[0xe] == cVar44);
          auVar46[0xf] = -(pcVar1[0xf] == bVar45);
          uVar20 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
          if (uVar20 != 0) {
            do {
              uVar11 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              if ((SourceLocation)imported ==
                  *(SourceLocation *)(importDedup._56_8_ + uVar28 * 0x78 + (ulong)uVar11 * 8))
              goto LAB_002ad0ac;
              uVar20 = uVar20 - 1 & uVar20;
            } while (uVar20 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar36 & 7] & pcVar1[0xf]) == 0)
          break;
          lVar33 = uVar28 + uVar37;
          uVar37 = uVar37 + 1;
          uVar28 = lVar33 + 1U & importDedup._40_8_;
        } while (uVar37 <= (ulong)importDedup._40_8_);
        if ((ulong)importDedup._72_8_ < (ulong)importDedup._64_8_) {
          SVar32 = (SourceLocation)&importDedup.super_Storage.field_0x18;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
          ::unchecked_emplace_at<slang::ast::Symbol_const*&>
                    ((locator *)&local_e0,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                      *)SVar32,uVar29,uVar36,&imported);
        }
        else {
          SVar32 = (SourceLocation)&importDedup.super_Storage.field_0x18;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*&>
                    ((locator *)&local_e0,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                      *)SVar32,uVar36,&imported);
        }
        pSVar25 = imported;
        sVar16 = imports.super_SmallVectorBase<Import>.len;
        SVar34 = (SourceLocation)
                 (imports.super_SmallVectorBase<Import>.data_ +
                 imports.super_SmallVectorBase<Import>.len);
        if (imports.super_SmallVectorBase<Import>.len == imports.super_SmallVectorBase<Import>.cap)
        {
          if (-imports.super_SmallVectorBase<Import>.len == -0x7ffffffffffffff) {
            slang::detail::throwLengthError();
          }
          uVar28 = imports.super_SmallVectorBase<Import>.len + 1;
          if (imports.super_SmallVectorBase<Import>.len + 1 <
              imports.super_SmallVectorBase<Import>.len * 2) {
            uVar28 = imports.super_SmallVectorBase<Import>.len * 2;
          }
          if (-imports.super_SmallVectorBase<Import>.len + 0x7ffffffffffffff <
              imports.super_SmallVectorBase<Import>.len) {
            uVar28 = 0x7ffffffffffffff;
          }
          pIVar24 = (pointer)operator_new(uVar28 << 4);
          pIVar24[sVar16].imported = pSVar25;
          pIVar24[sVar16].import = this_00;
          __n = (long)imports.super_SmallVectorBase<Import>.data_ +
                (imports.super_SmallVectorBase<Import>.len * 0x10 - (long)SVar34);
          if (__n == 0) {
            SVar32 = (SourceLocation)imports.super_SmallVectorBase<Import>.data_;
            if (imports.super_SmallVectorBase<Import>.len != 0) {
              memmove(pIVar24,imports.super_SmallVectorBase<Import>.data_,
                      imports.super_SmallVectorBase<Import>.len * 0x10);
            }
          }
          else {
            if ((SourceLocation)imports.super_SmallVectorBase<Import>.data_ != SVar34) {
              memmove(pIVar24,imports.super_SmallVectorBase<Import>.data_,
                      (long)SVar34 - (long)imports.super_SmallVectorBase<Import>.data_);
            }
            memcpy(pIVar24 + sVar16 + 1,(void *)SVar34,__n);
            SVar32 = SVar34;
          }
          SmallVectorBase<Import>::cleanup
                    (&imports.super_SmallVectorBase<Import>,(EVP_PKEY_CTX *)SVar32);
          imports.super_SmallVectorBase<Import>.len = imports.super_SmallVectorBase<Import>.len + 1;
          imports.super_SmallVectorBase<Import>.data_ = pIVar24;
          imports.super_SmallVectorBase<Import>.cap = uVar28;
        }
        else {
          *(Symbol **)SVar34 = imported;
          ((string_view *)((long)SVar34 + 8))->_M_len = (size_t)this_00;
          imports.super_SmallVectorBase<Import>.len = imports.super_SmallVectorBase<Import>.len + 1;
        }
      }
    }
LAB_002ad0ac:
    ppWVar38 = ppWVar38 + 1;
  }
  if (imports.super_SmallVectorBase<Import>.len == 0) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                   *)&importDedup.super_Storage.field_0x18);
    SmallVectorBase<Import>::cleanup(&imports.super_SmallVectorBase<Import>,(EVP_PKEY_CTX *)SVar32);
    goto LAB_002ad4bc;
  }
  if (imports.super_SmallVectorBase<Import>.len != 1) {
    if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
      sourceRange_02.endLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      sourceRange_02.startLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      pDVar26 = LookupResult::addDiag(result,scope,(DiagCode)0xa,sourceRange_02);
      arg_00._M_str = name_local._M_str;
      arg_00._M_len = name_local._M_len;
      SVar32 = (SourceLocation)name_local._M_len;
      Diagnostic::operator<<(pDVar26,arg_00);
      pIVar24 = imports.super_SmallVectorBase<Import>.data_;
      for (lVar33 = imports.super_SmallVectorBase<Import>.len << 4; lVar33 != 0;
          lVar33 = lVar33 + -0x10) {
        Diagnostic::addNote(pDVar26,(DiagCode)0x3f000a,(pIVar24->import->super_Symbol).location);
        SVar32 = (SourceLocation)0x50001;
        Diagnostic::addNote(pDVar26,(DiagCode)0x50001,pIVar24->imported->location);
        pIVar24 = pIVar24 + 1;
      }
    }
    goto LAB_002ad645;
  }
  if ((SVar35 != (SourceLocation)0x0) &&
     (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged == true)) {
    if (*(int *)SVar35 == 0x33) {
      pSVar25 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)SVar35);
      if (pSVar25 == (imports.super_SmallVectorBase<Import>.data_)->imported) goto LAB_002ad303;
    }
    sourceRange_01.endLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
    sourceRange_01.startLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
    pDVar26 = LookupResult::addDiag(result,scope,(DiagCode)0x10000a,sourceRange_01);
    arg._M_str = name_local._M_str;
    arg._M_len = name_local._M_len;
    Diagnostic::operator<<(pDVar26,arg);
    Diagnostic::addNote(pDVar26,(DiagCode)0x50001,*(SourceLocation *)((long)SVar35 + 0x18));
    Diagnostic::addNote(pDVar26,(DiagCode)0x3f000a,
                        ((imports.super_SmallVectorBase<Import>.data_)->import->super_Symbol).
                        location);
    Diagnostic::addNote(pDVar26,(DiagCode)0x50001,
                        (imports.super_SmallVectorBase<Import>.data_)->imported->location);
  }
LAB_002ad303:
  (result->flags).m_bits = (result->flags).m_bits | 1;
  result->found = (imports.super_SmallVectorBase<Import>.data_)->imported;
  Compilation::noteReference
            (scope->compilation,&(imports.super_SmallVectorBase<Import>.data_)->import->super_Symbol
             ,false);
  SVar35 = (SourceLocation)&pWVar7->importedSymbols;
  sv = &result->found->name;
  uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)SVar35,sv
                     );
  uVar36 = uVar22 >> ((byte)(pWVar7->importedSymbols).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar33 = (uVar22 & 0xff) * 4;
  uVar13 = (&UNK_0040c7ac)[lVar33];
  uVar14 = (&UNK_0040c7ad)[lVar33];
  uVar15 = (&UNK_0040c7ae)[lVar33];
  bVar45 = (&UNK_0040c7af)[lVar33];
  uVar29 = 0;
  uVar28 = uVar36;
  do {
    pgVar9 = (pWVar7->importedSymbols).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
             .arrays.groups_;
    pgVar2 = pgVar9 + uVar28;
    bVar47 = pgVar2->m[0xf].n;
    auVar42[0] = -(pgVar2->m[0].n == uVar13);
    auVar42[1] = -(pgVar2->m[1].n == uVar14);
    auVar42[2] = -(pgVar2->m[2].n == uVar15);
    auVar42[3] = -(pgVar2->m[3].n == bVar45);
    auVar42[4] = -(pgVar2->m[4].n == uVar13);
    auVar42[5] = -(pgVar2->m[5].n == uVar14);
    auVar42[6] = -(pgVar2->m[6].n == uVar15);
    auVar42[7] = -(pgVar2->m[7].n == bVar45);
    auVar42[8] = -(pgVar2->m[8].n == uVar13);
    auVar42[9] = -(pgVar2->m[9].n == uVar14);
    auVar42[10] = -(pgVar2->m[10].n == uVar15);
    auVar42[0xb] = -(pgVar2->m[0xb].n == bVar45);
    auVar42[0xc] = -(pgVar2->m[0xc].n == uVar13);
    auVar42[0xd] = -(pgVar2->m[0xd].n == uVar14);
    auVar42[0xe] = -(pgVar2->m[0xe].n == uVar15);
    auVar42[0xf] = -(bVar47 == bVar45);
    uVar21 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
    if (uVar21 != 0) {
      ppVar10 = (pWVar7->importedSymbols).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .arrays.elements_;
      do {
        uVar20 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        SVar32 = (SourceLocation)sv;
        bVar17 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            SVar35,sv,&ppVar10[uVar28 * 0xf + (ulong)uVar20].first);
        if (bVar17) goto LAB_002ad645;
        uVar21 = uVar21 - 1 & uVar21;
      } while (uVar21 != 0);
      bVar47 = pgVar9[uVar28].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bVar47) == 0) break;
    uVar37 = (pWVar7->importedSymbols).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
             .arrays.groups_size_mask;
    lVar33 = uVar28 + uVar29;
    uVar29 = uVar29 + 1;
    uVar28 = lVar33 + 1U & uVar37;
  } while (uVar29 <= uVar37);
  if ((pWVar7->importedSymbols).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
      .size_ctrl.size <
      (pWVar7->importedSymbols).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
              (&local_e0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                *)SVar35,uVar36,uVar22,(try_emplace_args_t *)&imported,sv,&result->found);
    SVar32 = SVar35;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
              (&local_e0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                *)SVar35,uVar22,(try_emplace_args_t *)&imported,sv,&result->found);
    SVar32 = SVar35;
  }
LAB_002ad645:
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                 *)&importDedup.super_Storage.field_0x18);
  SmallVectorBase<Import>::cleanup(&imports.super_SmallVectorBase<Import>,(EVP_PKEY_CTX *)SVar32);
  return;
}

Assistant:

void Lookup::unqualifiedImpl(const Scope& scope, std::string_view name, LookupLocation location,
                             std::optional<SourceRange> sourceRange, bitmask<LookupFlags> flags,
                             SymbolIndex outOfBlockIndex, LookupResult& result,
                             const Scope& originalScope, const SyntaxNode* originalSyntax) {
    auto reportRecursiveError = [&](const Symbol& symbol) {
        if (sourceRange) {
            auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *sourceRange);
            diag << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        result.found = nullptr;
    };

    // Try a simple name lookup to see if we find anything.
    auto& nameMap = scope.getNameMap();
    const Symbol* symbol = nullptr;
    if (auto it = nameMap.find(name); it != nameMap.end()) {
        // If the lookup is for a local name, check that we can access the symbol (it must be
        // declared before use). Callables and block names can be referenced anywhere in the
        // scope, so the location doesn't matter for them.
        symbol = it->second;
        bool locationGood = LookupLocation::before(*symbol) < location;
        if (!locationGood) {
            // A type alias can have forward definitions, so check those locations as well.
            // The forward decls form a linked list that are always ordered by location,
            // so we only need to check the first one.
            const ForwardingTypedefSymbol* forward = nullptr;
            switch (symbol->kind) {
                case SymbolKind::TypeAlias:
                    forward = symbol->as<TypeAliasType>().getFirstForwardDecl();
                    break;
                case SymbolKind::ClassType:
                    forward = symbol->as<ClassType>().getFirstForwardDecl();
                    break;
                case SymbolKind::GenericClassDef:
                    forward = symbol->as<GenericClassDefSymbol>().getFirstForwardDecl();
                    break;
                case SymbolKind::Subroutine: {
                    // Subroutines can be referenced before they are declared if they
                    // are tasks or return void (tasks are always set to have a void
                    // return type internally so we only need one check here).
                    //
                    // It's important to check that we're not in the middle of evaluating
                    // the return type before we try to access that return type or
                    // we'll hard fail.
                    auto& sub = symbol->as<SubroutineSymbol>();
                    if (sub.declaredReturnType.isEvaluating()) {
                        reportRecursiveError(*symbol);
                        return;
                    }

                    // Also allow built-ins to always be found; they don't really
                    // have a location since they're intrinsically defined.
                    locationGood = sub.getReturnType().isVoid() ||
                                   sub.flags.has(MethodFlags::BuiltIn);
                    break;
                }
                case SymbolKind::MethodPrototype: {
                    // Same as above.
                    auto& sub = symbol->as<MethodPrototypeSymbol>();
                    if (sub.declaredReturnType.isEvaluating()) {
                        reportRecursiveError(*symbol);
                        return;
                    }

                    locationGood = sub.getReturnType().isVoid() ||
                                   sub.flags.has(MethodFlags::BuiltIn);
                    break;
                }
                case SymbolKind::Sequence:
                case SymbolKind::Property:
                    // Sequences and properties can always be referenced before declaration.
                    locationGood = true;
                    break;
                case SymbolKind::Parameter:
                case SymbolKind::Specparam:
                case SymbolKind::EnumValue:
                    // Constants can never be looked up before their declaration,
                    // to avoid problems with recursive constant evaluation.
                    flags &= ~LookupFlags::AllowDeclaredAfter;
                    break;
                default:
                    break;
            }

            if (forward) {
                locationGood = LookupLocation::before(*forward) < location;
                result.flags |= LookupResultFlags::FromForwardTypedef;
            }
        }
        else if (symbol->kind == SymbolKind::TransparentMember && originalSyntax) {
            // Enum values are special in that we can't always get a precise ordering
            // of where they are declared in a scope, since they can be declared inside
            // a nested subexpression. Check for correct location by looking at the
            // actual source locations involved.
            auto& wrapped = symbol->as<TransparentMemberSymbol>().wrapped;
            if (wrapped.kind == SymbolKind::EnumValue) {
                // If the enum was inherited from a base class then we shouldn't
                // worry about the source location; the base class may be declared
                // later in the file.
                bool skipLocationCheck = false;
                auto enumScope = wrapped.getParentScope()->asSymbol().getParentScope();
                SLANG_ASSERT(enumScope);
                if (enumScope->asSymbol().kind == SymbolKind::ClassType) {
                    auto containingClass = getContainingClass(scope).first;
                    if (containingClass &&
                        containingClass->isDerivedFrom(enumScope->asSymbol().as<ClassType>())) {
                        skipLocationCheck = true;
                    }
                }

                if (auto sm = scope.getCompilation().getSourceManager(); sm && !skipLocationCheck) {
                    auto loc = originalSyntax->getFirstToken().location();
                    locationGood =
                        sm->isBeforeInCompilationUnit(wrapped.location, loc).value_or(true);
                }
            }
        }

        if (locationGood || flags.has(LookupFlags::AllowDeclaredAfter)) {
            // Unwrap the symbol if it's hidden behind an import or hoisted enum member.
            if (symbol->kind == SymbolKind::TransparentMember) {
                do {
                    symbol = &symbol->as<TransparentMemberSymbol>().wrapped;
                } while (symbol->kind == SymbolKind::TransparentMember);

                // Special case check for a lookup finding hoisted members of an anonymous
                // program. For these we need to verify that the original lookup location is
                // also in a program.
                if (symbol->getParentScope()->asSymbol().kind == SymbolKind::AnonymousProgram &&
                    !isInProgram(originalScope.asSymbol()) && sourceRange) {
                    auto& diag = result.addDiag(scope, diag::IllegalReferenceToProgramItem,
                                                *sourceRange);
                    diag.addNote(diag::NoteDeclarationHere, symbol->location);
                }
            }

            switch (symbol->kind) {
                case SymbolKind::ExplicitImport:
                    result.found = symbol->as<ExplicitImportSymbol>().importedSymbol();
                    result.flags |= LookupResultFlags::WasImported;
                    scope.getCompilation().noteReference(*symbol);
                    break;
                case SymbolKind::ForwardingTypedef:
                    // If we find a forwarding typedef, the actual typedef was never defined.
                    // Just ignore it, we'll issue a better error later.
                    break;
                case SymbolKind::MethodPrototype:
                    // Looking up a prototype should always forward on to the actual method.
                    result.found = symbol->as<MethodPrototypeSymbol>().getSubroutine();
                    break;
                case SymbolKind::ModportClocking:
                    result.found = symbol->as<ModportClockingSymbol>().target;
                    break;
                default:
                    result.found = symbol;
                    break;
            }

            // We have a fully resolved and valid symbol. Before we return back to the caller,
            // make sure that the symbol we're returning isn't in the process of having its type
            // evaluated. This can only happen with a mutually recursive definition of something
            // like a parameter and a function, so detect and report the error here to avoid a
            // stack overflow.
            bool done = true;
            if (result.found) {
                auto declaredType = result.found->getDeclaredType();
                if (declaredType && declaredType->isEvaluating()) {
                    if (locationGood) {
                        reportRecursiveError(*result.found);
                    }
                    else {
                        // We overrode the location checking via a flag and
                        // it's probably biting us now by causing us to find
                        // our own symbol when we otherwise shouldn't.
                        // Work around this by just pretending we didn't find anything.
                        done = false;
                        result.clear();
                    }
                }
            }

            if (done)
                return;
        }
    }

    // Look through any wildcard imports prior to the lookup point and see if their packages
    // contain the name we're looking for.
    if (auto wildcardImportData = scope.getWildcardImportData()) {
        if (flags.has(LookupFlags::DisallowWildcardImport)) {
            // We're in a context that disallows new imports via wildcard imports,
            // but we can still reference any symbols that were previously imported
            // that way from some other lookup. In order to be sure we've seen all of
            // those lookups we need to force elaborate the scope first.
            if (!wildcardImportData->hasForceElaborated) {
                wildcardImportData->hasForceElaborated = true;
                scope.getCompilation().forceElaborate(scope.asSymbol());
            }

            if (auto it = wildcardImportData->importedSymbols.find(name);
                it != wildcardImportData->importedSymbols.end()) {
                result.flags |= LookupResultFlags::WasImported;
                result.found = it->second;
                return;
            }
        }
        else {
            struct Import {
                const Symbol* imported;
                const WildcardImportSymbol* import;
            };
            SmallVector<Import, 4> imports;
            SmallSet<const Symbol*, 2> importDedup;

            for (auto import : wildcardImportData->wildcardImports) {
                if (location < LookupLocation::after(*import))
                    break;

                auto package = import->getPackage();
                if (!package) {
                    result.flags |= LookupResultFlags::SuppressUndeclared;
                    continue;
                }

                const Symbol* imported = package->findForImport(name);
                if (imported && importDedup.emplace(imported).second)
                    imports.emplace_back(Import{imported, import});
            }

            if (!imports.empty()) {
                if (imports.size() > 1) {
                    if (sourceRange) {
                        auto& diag = result.addDiag(scope, diag::AmbiguousWildcardImport,
                                                    *sourceRange);
                        diag << name;
                        for (const auto& pair : imports) {
                            diag.addNote(diag::NoteImportedFrom, pair.import->location);
                            diag.addNote(diag::NoteDeclarationHere, pair.imported->location);
                        }
                    }
                    return;
                }

                if (symbol && sourceRange) {
                    // The existing symbol might be an import for the thing we just imported
                    // via wildcard, which is fine so don't error for that case.
                    if (symbol->kind != SymbolKind::ExplicitImport ||
                        symbol->as<ExplicitImportSymbol>().importedSymbol() !=
                            imports[0].imported) {

                        auto& diag = result.addDiag(scope, diag::ImportNameCollision, *sourceRange);
                        diag << name;
                        diag.addNote(diag::NoteDeclarationHere, symbol->location);
                        diag.addNote(diag::NoteImportedFrom, imports[0].import->location);
                        diag.addNote(diag::NoteDeclarationHere, imports[0].imported->location);
                    }
                }

                result.flags |= LookupResultFlags::WasImported;
                result.found = imports[0].imported;
                scope.getCompilation().noteReference(*imports[0].import);

                wildcardImportData->importedSymbols.try_emplace(result.found->name, result.found);
                return;
            }
        }
    }

    // Continue up the scope chain via our parent.
    location = LookupLocation::after(scope.asSymbol());
    if (!location.getScope())
        return;

    // If this scope was an out-of-block subroutine, tell the next recursive call about it.
    // Otherwise, if our previous call was for such a situation and we didn't find the symbol
    // in this class scope, we need to use the subroutine's out-of-block lookup location
    // instead in order to properly handle cases like:
    //   class C;
    //     extern function int foo;
    //   endclass
    //   localparam int k = ...;
    //   function int C::foo;
    //     return k;
    //   endfunction
    auto& sym = scope.asSymbol();
    if (sym.kind == SymbolKind::Subroutine) {
        outOfBlockIndex = sym.as<SubroutineSymbol>().outOfBlockIndex;
    }
    else if (sym.kind == SymbolKind::ConstraintBlock) {
        outOfBlockIndex = sym.as<ConstraintBlockSymbol>().getOutOfBlockIndex();
    }
    else if (uint32_t(outOfBlockIndex) != 0) {
        location = LookupLocation(location.getScope(), uint32_t(outOfBlockIndex));
        outOfBlockIndex = SymbolIndex(0);
    }

    if (sym.kind == SymbolKind::ClassType) {
        // Suppress errors when we fail to find a symbol inside a class that
        // had a problem resolving its base class, since the symbol may be
        // expected to be defined in the base.
        auto baseClass = sym.as<ClassType>().getBaseClass();
        if (baseClass && baseClass->isError())
            result.flags |= LookupResultFlags::SuppressUndeclared;
    }

    if (flags.has(LookupFlags::DisallowUnitReferences) &&
        location.getScope()->asSymbol().kind == SymbolKind::CompilationUnit) {
        return;
    }

    return unqualifiedImpl(*location.getScope(), name, location, sourceRange, flags,
                           outOfBlockIndex, result, originalScope, originalSyntax);
}